

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
::
find_or_prepare_insert<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20250127::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
          *this,pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>
                *key)

{
  AssertHashEqConsistent<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
            (this,key);
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>_>
              *)this);
  if (*(long *)this == 1) {
    find_or_prepare_insert_soo<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
              (__return_storage_ptr__,this,key);
  }
  else {
    if (*(long *)this == 0) {
      __assert_fail("cap >= kDefaultCapacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xb75,
                    "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>, Alloc = std::allocator<std::pair<const google::protobuf::Message *, const google::protobuf::FieldDescriptor *>>]"
                   );
    }
    find_or_prepare_insert_non_soo<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
              (__return_storage_ptr__,this,key);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert(const K& key) {
    AssertOnFind(key);
    if (is_soo()) return find_or_prepare_insert_soo(key);
    return find_or_prepare_insert_non_soo(key);
  }